

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib543.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uchar a [20];
  
  a[0] = 0x9c;
  a[1] = '&';
  a[2] = 'K';
  a[3] = '=';
  a[4] = 'I';
  a[5] = '\x04';
  a[6] = 0xa1;
  a[7] = '\x01';
  a[8] = 0xe0;
  a[9] = 0xd8;
  a[10] = '|';
  a[0xb] = ' ';
  a[0xc] = 0xb7;
  a[0xd] = 0xef;
  a[0xe] = 'S';
  a[0xf] = ')';
  a[0x10] = 0xfa;
  a[0x11] = '\x1d';
  a[0x12] = 'W';
  a[0x13] = 0xe1;
  lVar2 = curl_easy_init();
  if (lVar2 == 0) {
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    iVar1 = 0x7e;
  }
  else {
    lVar3 = curl_easy_escape(lVar2,a,0x14);
    if (lVar3 != 0) {
      curl_mprintf("%s\n",lVar3);
      curl_free(lVar3);
    }
    curl_easy_cleanup(lVar2);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int test(char *URL)
{
  unsigned char a[] = {0x9c, 0x26, 0x4b, 0x3d, 0x49, 0x4, 0xa1, 0x1,
                       0xe0, 0xd8, 0x7c,  0x20, 0xb7, 0xef, 0x53, 0x29, 0xfa,
                       0x1d, 0x57, 0xe1};

  CURL *easy;
  int asize;
  char *s;
  (void)URL;

  easy = curl_easy_init();
  if(!easy) {
    fprintf(stderr, "curl_easy_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  asize = (int)sizeof(a);

  s = curl_easy_escape(easy, (char *)a, asize);

  if(s)
    printf("%s\n", s);

  if(s)
    curl_free(s);

  curl_easy_cleanup(easy);

  return 0;
}